

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

uint32_t __thiscall cppnet::TimerContainer::TimerRun(TimerContainer *this,uint32_t time)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  uint time_pass_00;
  bool bVar4;
  uint local_78;
  int32_t next_time_1;
  uint32_t run_setp;
  uint32_t local_64;
  int32_t next_time;
  uint32_t prev_time;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  sub_timer_solts;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  run_timer_solts;
  uint32_t run_setp_1;
  uint32_t sub_run_step;
  bool do_timer;
  uint32_t left_time;
  uint32_t time_pass;
  uint32_t time_local;
  TimerContainer *this_local;
  
  uVar1 = time / this->_time_unit;
  time_pass_00 = time % this->_time_unit;
  run_setp_1._3_1_ = uVar1 != 0;
  if (time_pass_00 != 0) {
    peVar3 = std::
             __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_sub_timer);
    iVar2 = (*(peVar3->super_Timer)._vptr_Timer[4])(peVar3,(ulong)time_pass_00);
    run_setp_1._3_1_ = iVar2 != 0 || run_setp_1._3_1_;
    this->_cur_time = iVar2 + this->_cur_time;
  }
  if (run_setp_1._3_1_) {
    std::
    vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    vector((vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
            *)&sub_timer_solts.
               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    vector((vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
            *)&next_time);
    local_64 = this->_cur_time;
    this->_cur_time = uVar1 + this->_cur_time;
    while ((local_64 = Bitmap::GetMinAfter(&this->_bitmap,local_64), -1 < (int)local_64 &&
           ((int)local_64 <= (int)this->_cur_time))) {
      GetIndexTimer(this,(vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                          *)&sub_timer_solts.
                             super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                     *)&next_time,local_64,time_pass_00);
      local_64 = local_64 + 1;
    }
    bVar4 = this->_size <= this->_cur_time;
    if (bVar4) {
      this->_cur_time = this->_cur_time - this->_size;
    }
    local_78 = (uint)bVar4;
    if (local_78 != 0) {
      local_64 = 0;
      while ((local_64 = Bitmap::GetMinAfter(&this->_bitmap,local_64), -1 < (int)local_64 &&
             ((int)local_64 <= (int)this->_cur_time))) {
        GetIndexTimer(this,(vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                            *)&sub_timer_solts.
                               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                       *)&next_time,local_64,time_pass_00);
        local_64 = local_64 + 1;
      }
    }
    DoTimer(this,(vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                  *)&sub_timer_solts.
                     super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
            (vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
             *)&next_time);
    this_local._4_4_ = local_78;
    std::
    vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    ~vector((vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
             *)&next_time);
    std::
    vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    ~vector((vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
             *)&sub_timer_solts.
                super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    run_timer_solts.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = this->_size <= this->_cur_time;
    if (run_timer_solts.
        super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) {
      this->_cur_time = this->_cur_time - this->_size;
    }
    run_timer_solts.
    super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
    this_local._4_4_ =
         (uint)run_timer_solts.
               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t TimerContainer::TimerRun(uint32_t time) {
    uint32_t time_pass = time / _time_unit;
    uint32_t left_time = time % _time_unit;
    bool do_timer = time_pass > 0;

    if (left_time > 0) {
        uint32_t sub_run_step = _sub_timer->TimerRun(left_time);
        if (sub_run_step > 0) {
            do_timer = true;
        }
        _cur_time += sub_run_step;
    }

    if (!do_timer) {
        uint32_t run_setp = 0;
        if (_cur_time >= _size) {
            _cur_time -= _size;
            run_setp++;
        }
        return run_setp;
    }

    std::vector<std::weak_ptr<TimerSlot>> run_timer_solts;
    std::vector<std::weak_ptr<TimerSlot>> sub_timer_solts;

    uint32_t prev_time = _cur_time;
    _cur_time += time_pass;
    while(1) {
        int32_t next_time = _bitmap.GetMinAfter(prev_time);
        if (next_time < 0) {
            break;
        }
        if (next_time > (int32_t)_cur_time) {
            break;
        }
        GetIndexTimer(run_timer_solts, sub_timer_solts, next_time, left_time);
        prev_time = next_time + 1;
    }

    uint32_t run_setp = 0;
    if (_cur_time >= _size) {
        _cur_time -= _size;
        run_setp++;
    }

    if (run_setp > 0) {
        prev_time = 0;
        while (1) {
            int32_t next_time = _bitmap.GetMinAfter(prev_time);
            if (next_time < 0) {
                break;
            }
            if (next_time > (int32_t)_cur_time) {
                break;
            }
            GetIndexTimer(run_timer_solts, sub_timer_solts, next_time, left_time);
            prev_time = next_time + 1;
        }
    }

    // timer call back
    DoTimer(run_timer_solts, sub_timer_solts);

    return run_setp;
}